

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basictests.cpp
# Opt level: O0

void test32<461u>(void)

{
  bool bVar1;
  uint32_t uVar2;
  uint extraout_EAX;
  uint extraout_EAX_00;
  ostream *poVar3;
  void *pvVar4;
  double __x;
  double __x_00;
  double in_XMM1_Qa;
  bool mult_ok;
  bool remainder_ok;
  bool quotient_ok;
  uint32_t n;
  uint local_4;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"(32-bit) testing ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,0x1cd);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  local_4 = 1;
  while( true ) {
    if (local_4 == 0) {
      return;
    }
    uVar2 = fast_division::divide32<461U>::quotient(0);
    fast_division::divide32<461U>::remainder(__x,in_XMM1_Qa);
    bVar1 = fast_division::divide32<461U>::is_divisible(0);
    if (((uVar2 != local_4 / 0x1cd) || (extraout_EAX != local_4 % 0x1cd)) ||
       (bVar1 != (local_4 % 0x1cd == 0))) break;
    local_4 = local_4 + 1;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"problem with n = ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,local_4);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"quotient: ");
  uVar2 = fast_division::divide32<461U>::quotient(0);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar2);
  poVar3 = std::operator<<(poVar3," expected: ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,local_4 / 0x1cd);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"remainder: ");
  fast_division::divide32<461U>::remainder(__x_00,in_XMM1_Qa);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,extraout_EAX_00);
  poVar3 = std::operator<<(poVar3," expected: ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,local_4 % 0x1cd);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"multiple: ");
  bVar1 = fast_division::divide32<461U>::is_divisible(0);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,bVar1);
  poVar3 = std::operator<<(poVar3," expected: ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,local_4 % 0x1cd == 0);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"need_fallback = ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,false);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"is_power_2    = ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,false);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"c             = ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,0x8e2917e1);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"leading_zeroes= ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,0x17);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"log2_divisor  = ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,8);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"m             = ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,0x10000000000);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"overflow      = ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,false);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  abort();
}

Assistant:

void test32() {
  std::cout << "(32-bit) testing " << divisor << std::endl;
  for (uint32_t n = 1; n != 0; n++) {
    bool quotient_ok =
        fast_division::divide32<divisor>::quotient(n) == n / divisor;
    bool remainder_ok =
        fast_division::divide32<divisor>::remainder(n) == n % divisor;
    bool mult_ok =
        fast_division::divide32<divisor>::is_divisible(n) == (n % divisor == 0);
    if (!quotient_ok || !remainder_ok || !mult_ok) {
      std::cerr << "problem with n = " << n << std::endl;
      std::cout << "quotient: " << fast_division::divide32<divisor>::quotient(n)
                << " expected: " << n / divisor << std::endl;
      std::cout << "remainder: "
                << fast_division::divide32<divisor>::remainder(n)
                << " expected: " << n % divisor << std::endl;
      std::cout << "multiple: "
                << fast_division::divide32<divisor>::is_divisible(n)
                << " expected: " << (n % divisor == 0) << std::endl;

      std::cout << "need_fallback = "
                << fast_division::divide32<divisor>::need_fallback << std::endl;
      std::cout << "is_power_2    = "
                << fast_division::divide32<divisor>::is_power_2 << std::endl;
      std::cout << "c             = " << fast_division::divide32<divisor>::c
                << std::endl;
      std::cout << "leading_zeroes= "
                << fast_division::divide32<divisor>::leading_zeroes
                << std::endl;
      std::cout << "log2_divisor  = "
                << fast_division::divide32<divisor>::log2_divisor << std::endl;
      std::cout << "m             = " << fast_division::divide32<divisor>::m
                << std::endl;
      std::cout << "overflow      = "
                << fast_division::divide32<divisor>::overflow << std::endl;

      abort();
    }
  }
}